

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

bool __thiscall Js::RecyclableObject::HasOnlyWritableDataProperties(RecyclableObject *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  byte bVar3;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  CustomExternalWrapperObject *pCVar4;
  undefined1 uVar5;
  
  bVar2 = DynamicType::Is(((this->type).ptr)->typeId);
  uVar5 = 1;
  if (bVar2) {
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    bVar3 = DynamicTypeHandler::GetPropertyTypes(this_01);
    if (((bVar3 & 0x10) == 0) ||
       ((bVar2 = DynamicObject::HasObjectArray(this_00), bVar2 &&
        (bVar2 = HasOnlyWritableDataProperties((RecyclableObject *)this_00->field_1), !bVar2)))) {
      uVar5 = 0;
    }
    else {
      pp_Var1 = (this_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if ((pp_Var1 == (_func_int **)VirtualTableInfo<Js::CustomExternalWrapperObject>::Address) ||
         (pp_Var1 ==
          (_func_int **)
          VirtualTableInfo<Js::CrossSiteObject<Js::CustomExternalWrapperObject>_>::Address)) {
        pCVar4 = UnsafeVarTo<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
        uVar5 = pCVar4->initialized;
      }
    }
    return (bool)uVar5;
  }
  return true;
}

Assistant:

bool RecyclableObject::HasOnlyWritableDataProperties()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->GetHasOnlyWritableDataProperties() &&
                (!obj->HasObjectArray() || obj->GetObjectArrayOrFlagsAsArray()->HasOnlyWritableDataProperties())
#ifdef _CHAKRACOREBUILD
                && (!VarIs<CustomExternalWrapperObject>(obj) || UnsafeVarTo<CustomExternalWrapperObject>(obj)->IsInitialized())
#endif
                ;
        }

        return true;
    }